

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>>
::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  Dimension DVar1;
  int iVar2;
  size_type sVar3;
  int local_70;
  int local_68;
  uint local_30;
  Dimension local_2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_28;
  Dimension dim_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>>
  *pCStack_18;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>
  *this_local;
  
  local_2c = dim;
  pvStack_28 = boundary;
  boundary_local._4_4_ = cellID;
  pCStack_18 = this;
  this_local = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>
                *)__return_storage_ptr__;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x68));
  if (sVar3 <= boundary_local._4_4_) {
    iVar2 = boundary_local._4_4_ * 2;
    local_30 = Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
               ::get_null_value<unsigned_int>();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x68),
               (ulong)(iVar2 + 1),&local_30);
  }
  DVar1 = local_2c;
  iVar2 = Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
          ::get_null_value<int>();
  if (DVar1 == iVar2) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_28);
    if (sVar3 == 0) {
      local_68 = 0;
    }
    else {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_28);
      local_68 = (int)sVar3 + -1;
    }
    local_70 = local_68;
  }
  else {
    local_70 = local_2c;
  }
  Matrix_max_dimension_holder<int>::update_up((Matrix_max_dimension_holder<int> *)this,local_70);
  _reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (__return_storage_ptr__,this,boundary_local._4_4_,pvStack_28,local_2c);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::insert_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    if (pivotToColumnIndex_.size() <= cellID) {
      pivotToColumnIndex_.resize(cellID * 2 + 1, Master_matrix::template get_null_value<Index>());
    }
  }

  if constexpr (Master_matrix::Option_list::has_vine_update && Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      Swap_opt::CP::pivotToPosition_.try_emplace(cellID, _nextPosition());
    } else {
      if (Swap_opt::CP::pivotToPosition_.size() <= cellID)
        Swap_opt::CP::pivotToPosition_.resize(pivotToColumnIndex_.size(),
                                              Master_matrix::template get_null_value<Pos_index>());
      Swap_opt::CP::pivotToPosition_[cellID] = _nextPosition();
    }
  }

  if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
    Dim_opt::update_up(dim == Master_matrix::template get_null_value<Dimension>()
                           ? (boundary.size() == 0 ? 0 : boundary.size() - 1)
                           : dim);
  }

  return _reduce_boundary(cellID, boundary, dim);
}